

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O0

int __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::link(dynamic_xpression<boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,char *__from,char *__to)

{
  int iVar1;
  matchable_ptr *this_00;
  char *__to_00;
  repeat_end_matcher<mpl_::bool_<false>_> *prVar2;
  
  prVar2 = &this->super_repeat_end_matcher<mpl_::bool_<false>_>;
  this_00 = shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::matchable(&this->next_);
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::get(this_00);
  xpression_linker<char>::accept<mpl_::bool_<false>>
            ((xpression_linker<char> *)__from,(repeat_end_matcher<mpl_::bool_<false>_> *)this,prVar2
            );
  iVar1 = shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::link(&this->next_,__from,__to_00);
  return iVar1;
}

Assistant:

virtual void link(xpression_linker<char_type> &linker) const
    {
        linker.accept(*static_cast<Matcher const *>(this), this->next_.matchable().get());
        this->next_.link(linker);
    }